

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

void __thiscall
crnlib::mipmapped_texture::set_orientation_flags(mipmapped_texture *this,orientation_flags_t flags)

{
  uint uVar1;
  uint uVar2;
  vector<crnlib::mip_level_*> *pvVar3;
  uint l;
  ulong uVar4;
  uint m;
  ulong uVar5;
  
  uVar1 = (this->m_faces).m_size;
  pvVar3 = (this->m_faces).m_p;
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    uVar2 = pvVar3[uVar4].m_size;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      pvVar3[uVar4].m_p[uVar5]->m_orient_flags = flags;
    }
  }
  return;
}

Assistant:

void mipmapped_texture::set_orientation_flags(orientation_flags_t flags) {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      m_faces[l][m]->set_orientation_flags(flags);
}